

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * to<char>(string *utf8)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  char *pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ostream *poVar2;
  runtime_error *this_00;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostringstream ss;
  uint prev;
  uint point;
  uint i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out;
  difference_type in_stack_fffffffffffffda0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffda8;
  string *s;
  uint *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  undefined1 local_1e9 [33];
  string local_1c8 [48];
  ostringstream local_198 [376];
  uint local_20;
  uint local_1c;
  uint local_18;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  local_18 = 0;
  while( true ) {
    __beg._M_current = (char *)(ulong)local_18;
    pcVar1 = (char *)std::__cxx11::string::size();
    if (pcVar1 <= __beg._M_current) {
      return in_RDI;
    }
    local_20 = local_18;
    local_1c = utf8_next(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    if (0xff < local_1c) break;
    std::__cxx11::string::operator+=((string *)in_RDI,(char)local_1c);
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  __end._M_current = (char *)std::operator<<((ostream *)local_198,"Can\'t convert codepoint U");
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::ostream::operator<<(__end._M_current,std::hex);
  poVar2 = (ostream *)std::ostream::operator<<(this,local_1c);
  this_00 = (runtime_error *)std::operator<<(poVar2,"(");
  local_1e9._17_8_ = std::__cxx11::string::begin();
  local_1e9._25_8_ =
       __gnu_cxx::
       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  local_1e9._1_8_ = std::__cxx11::string::begin();
  local_1e9._9_8_ =
       __gnu_cxx::
       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  s = (string *)local_1e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            (this,__beg,__end,(allocator<char> *)poVar2);
  poVar2 = std::operator<<((ostream *)this_00,local_1c8);
  std::operator<<(poVar2,") to Latin1");
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)local_1e9);
  uVar3 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  booster::runtime_error::runtime_error(this_00,s);
  __cxa_throw(uVar3,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

std::basic_string<Char> to(std::string const &utf8)
{
    std::basic_string<Char> out;
    unsigned i=0;
    while(i<utf8.size()) {
        unsigned point;
        unsigned prev=i;
        point = utf8_next(utf8,i);
        if(sizeof(Char)==1 && point > 255) {
            std::ostringstream ss;
            ss << "Can't convert codepoint U" << std::hex << point <<"(" <<std::string(utf8.begin()+prev,utf8.begin()+i)<<") to Latin1";
            throw booster::runtime_error(ss.str());
        }
        else if(sizeof(Char)==2 && point >0xFFFF) { // Deal with surragates
            point-=0x10000;
            out+=static_cast<Char>(0xD800 | (point>>10));
            out+=static_cast<Char>(0xDC00 | (point & 0x3FF));
            continue;
        }
        out+=static_cast<Char>(point);
    }
    return out;
}